

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

ExternFuncInfo * nullcFindModuleFunction(char *module,char *name,int index)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ByteCode *code;
  ExternFuncInfo *pEVar6;
  uint uVar7;
  TraceScope traceScope;
  TraceScope local_40;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    pEVar6 = (ExternFuncInfo *)0x0;
  }
  else {
    if ((nullcFindModuleFunction(char_const*,char_const*,int)::token == '\0') &&
       (iVar4 = __cxa_guard_acquire(&nullcFindModuleFunction(char_const*,char_const*,int)::token),
       iVar4 != 0)) {
      nullcFindModuleFunction::token = NULLC::TraceGetToken("nullc","nullcFindModuleFunction");
      __cxa_guard_release(&nullcFindModuleFunction(char_const*,char_const*,int)::token);
    }
    NULLC::TraceScope::TraceScope(&local_40,nullcFindModuleFunction::token);
    lVar2 = NULLC::traceContext;
    sVar5 = strlen(module);
    uVar7 = (int)sVar5 + 1;
    uVar3 = *(uint *)(lVar2 + 0x264);
    if ((uVar3 <= *(int *)(lVar2 + 0x260) + uVar7) ||
       (*(int *)(lVar2 + 0x270) == *(int *)(lVar2 + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 <= uVar7) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar3 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar3 + *(long *)(lVar2 + 0x268)),module,(ulong)uVar7);
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar7;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar7 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar7 + 1;
    *(uint *)(lVar1 + (ulong)uVar7 * 8) = uVar3 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar7 * 8) = 0;
    code = (ByteCode *)BinaryCache::FindBytecode(module,true);
    if (code == (ByteCode *)0x0) {
      NULLC::nullcLastError = "ERROR: failed to find module";
    }
    else {
      uVar3 = NULLC::GetStringHash(name);
      pEVar6 = FindFirstFunc(code);
      for (iVar4 = code->functionCount - code->moduleFunctionCount; iVar4 != 0; iVar4 = iVar4 + -1)
      {
        if (uVar3 == pEVar6->nameHash) {
          if (index == 0) goto LAB_0010cbd0;
          index = index + -1;
        }
        pEVar6 = pEVar6 + 1;
      }
      NULLC::SafeSprintf(NULLC::errorBuf,0x10000,
                         "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                         ,name,module);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    pEVar6 = (ExternFuncInfo *)0x0;
LAB_0010cbd0:
    NULLC::TraceScope::~TraceScope(&local_40);
  }
  return pEVar6;
}

Assistant:

ExternFuncInfo* nullcFindModuleFunction(const char* module, const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULL);

	TRACE_SCOPE("nullc", "nullcFindModuleFunction");
	TRACE_LABEL(module);

	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
	{
		nullcLastError = "ERROR: failed to find module";
		return NULL;
	}

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;

	for(unsigned i = 0; i < end; i++, fInfo++)
	{
		if(hash != fInfo->nameHash)
			continue;

		if(index == 0)
			return fInfo;

		index--;
	}

	NULLC::SafeSprintf(errorBuf, NULLC_ERROR_BUFFER_SIZE, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

	nullcLastError = errorBuf;
	return NULL;
}